

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeTypeUrlOrFullTypeName(ParserImpl *this)

{
  bool bVar1;
  string discarded;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeIdentifier(this,&local_90);
  if (bVar1) {
    do {
      std::__cxx11::string::string((string *)&local_50,".",&local_91);
      bVar1 = TryConsume(this,&local_50);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::string((string *)&local_70,"/",&local_92);
        bVar1 = TryConsume(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          bVar1 = true;
          goto LAB_00280c61;
        }
      }
      bVar1 = ConsumeIdentifier(this,&local_90);
    } while (bVar1);
  }
  bVar1 = false;
LAB_00280c61:
  std::__cxx11::string::~string((string *)&local_90);
  return bVar1;
}

Assistant:

bool ConsumeTypeUrlOrFullTypeName() {
    std::string discarded;
    DO(ConsumeIdentifier(&discarded));
    while (TryConsume(".") || TryConsume("/")) {
      DO(ConsumeIdentifier(&discarded));
    }
    return true;
  }